

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask20_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar1 = in[1];
  *out = uVar1 << 0x14 | uVar2;
  uVar1 = uVar1 >> 0xc;
  out[1] = uVar1;
  uVar1 = in[2] << 8 | uVar1;
  out[1] = uVar1;
  uVar2 = in[3];
  out[1] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[2] = uVar2;
  uVar1 = in[4];
  out[2] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[3] = uVar1;
  uVar1 = in[5] << 4 | uVar1;
  out[3] = uVar1;
  uVar2 = in[6];
  out[3] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[4] = uVar2;
  out[4] = in[7] << 0xc | uVar2;
  uVar2 = in[8];
  out[5] = uVar2;
  uVar1 = in[9];
  out[5] = uVar1 << 0x14 | uVar2;
  uVar1 = uVar1 >> 0xc;
  out[6] = uVar1;
  uVar1 = in[10] << 8 | uVar1;
  out[6] = uVar1;
  uVar2 = in[0xb];
  out[6] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[7] = uVar2;
  uVar1 = in[0xc];
  out[7] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[8] = uVar1;
  uVar1 = in[0xd] << 4 | uVar1;
  out[8] = uVar1;
  uVar2 = in[0xe];
  out[8] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[9] = uVar2;
  out[9] = in[0xf] << 0xc | uVar2;
  return out + 10;
}

Assistant:

uint32_t *__fastpackwithoutmask20_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (20 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (20 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (20 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (20 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (20 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (20 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (20 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (20 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  ++in;

  return out;
}